

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::hex_writer>
             *this,wchar_t **it)

{
  size_t sVar1;
  iterator begin;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *piVar2;
  hex_writer *in_RSI;
  wchar_t **in_RDI;
  wchar_t *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  wchar_t **__n;
  
  __n = in_RDI;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 1));
  if (sVar1 != 0) {
    begin = basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 1));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 1));
    piVar2 = (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *)
             copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                       (begin,in_stack_ffffffffffffffd8,(wchar_t *)0x20892d);
    in_RSI->self = piVar2;
  }
  piVar2 = (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *)
           std::fill_n<wchar_t*,unsigned_long,wchar_t>
                     (unaff_retaddr,(unsigned_long)__n,(wchar_t *)in_RSI);
  in_RSI->self = piVar2;
  int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::hex_writer::operator()
            (in_RSI,in_RDI);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }